

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.h
# Opt level: O2

char * __thiscall libssio::DataSource::readcstr(DataSource *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar4;
  ulong uVar5;
  
  iVar1 = (*this->_vptr_DataSource[0xf])();
  uVar5 = 1;
  while( true ) {
    iVar2 = (*this->_vptr_DataSource[4])(this);
    if (iVar2 == 0) break;
    iVar2 = (*this->_vptr_DataSource[0xf])(this);
    iVar3 = (*this->_vptr_DataSource[0xe])(this);
    if (CONCAT44(extraout_var_01,iVar3) <= CONCAT44(extraout_var_00,iVar2)) break;
    uVar5 = uVar5 + 1;
  }
  (*this->_vptr_DataSource[0xc])(this,CONCAT44(extraout_var,iVar1));
  pcVar4 = (char *)operator_new__(uVar5);
  (*this->_vptr_DataSource[0xb])(this,pcVar4,uVar5 & 0xffffffff);
  return pcVar4;
}

Assistant:

virtual char *   readcstr()         // read C (0-terminated) string
    {                                   // virtual to allow optimization
        position pos = getPos();
        size     len = 0;

        while ((read1() != '\0') && (getPos() < getSize()))
            len++;
        len++; // count for \0 too

        seek(pos);
        char *str = new char [len];
        read(str, len);

        return str;
    }